

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomColorGroup::read(DomColorGroup *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  DomColorRole *this_00;
  DomColor *this_01;
  size_t sVar3;
  void *__buf_00;
  void *__buf_01;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QStringView other;
  QStringView other_00;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_78;
  QArrayDataPointer<char16_t> local_60;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)CONCAT44(in_register_00000034,__fd));
      if (bVar1) goto LAB_00159f16;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      local_48.m_size = -0x5555555555555556;
      local_48.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
      local_48 = (QStringView)QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s((QString *)&local_60,L"colorrole",9);
      sVar3 = 0;
      other.m_data = local_60.ptr;
      other.m_size = local_60.size;
      iVar2 = QStringView::compare(&local_48,other,CaseInsensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
      if (iVar2 == 0) {
        this_00 = (DomColorRole *)operator_new(0x28);
        (this_00->m_attr_role).d.d = (Data *)0x0;
        (this_00->m_attr_role).d.ptr = (char16_t *)0x0;
        (this_00->m_attr_role).d.size = 0;
        this_00->m_has_attr_role = false;
        *(undefined3 *)&this_00->field_0x19 = 0;
        this_00->m_children = 0;
        this_00->m_brush = (DomBrush *)0x0;
        DomColorRole::read(this_00,__fd,__buf_00,sVar3);
        QList<DomColorRole_*>::append(&this->m_colorRole,this_00);
      }
      else {
        Qt::Literals::StringLiterals::operator____s((QString *)&local_60,L"color",5);
        sVar3 = 0;
        other_00.m_data = local_60.ptr;
        other_00.m_size = local_60.size;
        iVar2 = QStringView::compare(&local_48,other_00,CaseInsensitive);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
        if (iVar2 == 0) {
          this_01 = (DomColor *)operator_new(0x18);
          this_01->m_attr_alpha = 0;
          this_01->m_has_attr_alpha = false;
          *(undefined3 *)&this_01->field_0x5 = 0;
          this_01->m_children = 0;
          this_01->m_red = 0;
          this_01->m_green = 0;
          this_01->m_blue = 0;
          DomColor::read(this_01,__fd,__buf_01,sVar3);
          QList<DomColor_*>::append(&this->m_color,this_01);
        }
        else {
          local_78.a.m_size = 0x13;
          local_78.a.m_data = "Unexpected element ";
          local_78.b = &local_48;
          QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                    ((QString *)&local_60,&local_78);
          QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
        }
      }
    }
  } while (iVar2 != 5);
LAB_00159f16:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomColorGroup::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"colorrole"_s, Qt::CaseInsensitive)) {
                auto *v = new DomColorRole();
                v->read(reader);
                m_colorRole.append(v);
                continue;
            }
            if (!tag.compare(u"color"_s, Qt::CaseInsensitive)) {
                auto *v = new DomColor();
                v->read(reader);
                m_color.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}